

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O1

int Abc_NtkFraigStore(Abc_Ntk_t *pNtkAdd)

{
  uint uVar1;
  int iVar2;
  Abc_Ntk_t *pNtkOld;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  
  pNtkOld = Abc_NtkStrash(pNtkAdd,0,0,0);
  if (pNtkOld == (Abc_Ntk_t *)0x0) {
    puts("Abc_NtkFraigStore: Initial strashing has failed.");
    return 0;
  }
  pVVar3 = Abc_FrameReadStore();
  if ((0 < pVVar3->nSize) &&
     (iVar2 = Abc_NodeCompareCiCo(pNtkOld,(Abc_Ntk_t *)*pVVar3->pArray), iVar2 == 0)) {
    if (pVVar3->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    iVar2 = Abc_NtkCompareSignals(pNtkOld,(Abc_Ntk_t *)*pVVar3->pArray,1,1);
    if (iVar2 == 0) {
      puts("Trying to store the network with different primary inputs.");
      puts("The previously stored networks are deleted and this one is added.");
      Abc_NtkFraigStoreClean();
    }
  }
  uVar1 = pVVar3->nCap;
  if (pVVar3->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar4;
      iVar2 = 0x10;
    }
    else {
      iVar2 = uVar1 * 2;
      if (iVar2 <= (int)uVar1) goto LAB_002c6096;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
      }
      pVVar3->pArray = ppvVar4;
    }
    pVVar3->nCap = iVar2;
  }
LAB_002c6096:
  iVar2 = pVVar3->nSize;
  pVVar3->nSize = iVar2 + 1;
  pVVar3->pArray[iVar2] = pNtkOld;
  return 1;
}

Assistant:

int Abc_NtkFraigStore( Abc_Ntk_t * pNtkAdd )
{
    Vec_Ptr_t * vStore;
    Abc_Ntk_t * pNtk;
    // create the network to be stored
    pNtk = Abc_NtkStrash( pNtkAdd, 0, 0, 0 );
    if ( pNtk == NULL )
    {
        printf( "Abc_NtkFraigStore: Initial strashing has failed.\n" );
        return 0;
    }
    // get the network currently stored
    vStore = Abc_FrameReadStore();
    if ( Vec_PtrSize(vStore) > 0 )
    {
        // check that the networks have the same PIs
        extern int Abc_NodeCompareCiCo( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew );
        if ( !Abc_NodeCompareCiCo(pNtk, (Abc_Ntk_t *)Vec_PtrEntry(vStore, 0)) )
        {
            // reorder PIs of pNtk2 according to pNtk1
            if ( !Abc_NtkCompareSignals( pNtk, (Abc_Ntk_t *)Vec_PtrEntry(vStore, 0), 1, 1 ) )
            {
                printf( "Trying to store the network with different primary inputs.\n" );
                printf( "The previously stored networks are deleted and this one is added.\n" );
                Abc_NtkFraigStoreClean();
            }
        }
    }
    Vec_PtrPush( vStore, pNtk );
//    printf( "The number of AIG nodes added to storage = %5d.\n", Abc_NtkNodeNum(pNtk) );
    return 1;
}